

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL12_CDstatus SDL_CDStatus(SDL12_CD *cdrom)

{
  SDL12_CD *pSVar1;
  SDL12_CDstatus retval;
  SDL12_CD *cdrom_local;
  
  pSVar1 = ValidCDDevice(cdrom);
  if (pSVar1 == (SDL12_CD *)0x0) {
    cdrom_local._4_4_ = SDL12_CD_ERROR;
  }
  else {
    (*SDL20_LockAudio)();
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      pSVar1->status = audio_cbdata->cdrom_status;
      pSVar1->cur_track = audio_cbdata->cdrom_cur_track;
      pSVar1->cur_frame = audio_cbdata->cdrom_cur_frame;
    }
    cdrom_local._4_4_ = pSVar1->status;
    (*SDL20_UnlockAudio)();
  }
  return cdrom_local._4_4_;
}

Assistant:

SDLCALL
SDL_CDStatus(SDL12_CD *cdrom)
{
    SDL12_CDstatus retval;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return SDL12_CD_ERROR;
    }

    SDL20_LockAudio();  /* we update this during the audio callback. */
    if (audio_cbdata) {
        cdrom->status = audio_cbdata->cdrom_status;
        cdrom->cur_track = audio_cbdata->cdrom_cur_track;
        cdrom->cur_frame = audio_cbdata->cdrom_cur_frame;
    }
    retval = cdrom->status;
    SDL20_UnlockAudio();

    return retval;
}